

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O1

void __thiscall
Lists<std::shared_ptr<Eqclass>_>::append
          (Lists<std::shared_ptr<Eqclass>_> *this,shared_ptr<Eqclass> *item)

{
  element_type *peVar1;
  ListNodes<std::shared_ptr<Eqclass>_> *__p;
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> node;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->theSize = this->theSize + 1;
  __p = (ListNodes<std::shared_ptr<Eqclass>_> *)operator_new(0x20);
  local_48 = (item->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40._M_pi = (item->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__p->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_40);
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__p->theNext).
              super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_30);
  std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>>,(__gnu_cxx::_Lock_policy)2>::
  reset<ListNodes<std::shared_ptr<Eqclass>>>
            ((__shared_ptr<ListNodes<std::shared_ptr<Eqclass>>,(__gnu_cxx::_Lock_policy)2> *)
             &local_58,__p);
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if ((this->theHead).
      super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (this->theHead).
    super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->theHead).
                super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&_Stack_50);
  }
  else {
    peVar1 = (this->theLast).
             super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_28 = local_58;
    local_20._M_pi = _Stack_50._M_pi;
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
      }
    }
    (peVar1->theNext).
    super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->theNext).
                super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_20);
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  (this->theLast).
  super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->theLast).
              super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_50);
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

void Lists<T>::append(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == nullptr) {
        theHead = node;
        theLast = node;
    } else {
        theLast->set_next(node);
        theLast = node;
    }
}